

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcher.cpp
# Opt level: O3

void __thiscall efsw::FileWatcher::FileWatcher(FileWatcher *this)

{
  int iVar1;
  FileWatcherInotify *this_00;
  FileWatcherGeneric *this_01;
  
  this->_vptr_FileWatcher = (_func_int **)&PTR__FileWatcher_0012f9c0;
  this->mFollowSymlinks = false;
  this->mOutOfScopeLinks = false;
  this_00 = (FileWatcherInotify *)operator_new(0xf8);
  FileWatcherInotify::FileWatcherInotify(this_00,this);
  this->mImpl = (FileWatcherImpl *)this_00;
  iVar1 = (*(this_00->super_FileWatcherImpl)._vptr_FileWatcherImpl[8])(this_00);
  if ((char)iVar1 == '\0') {
    if (this->mImpl != (FileWatcherImpl *)0x0) {
      (*this->mImpl->_vptr_FileWatcherImpl[1])();
      this->mImpl = (FileWatcherImpl *)0x0;
    }
    this_01 = (FileWatcherGeneric *)operator_new(0x48);
    FileWatcherGeneric::FileWatcherGeneric(this_01,this);
    this->mImpl = (FileWatcherImpl *)this_01;
  }
  return;
}

Assistant:

FileWatcher::FileWatcher() : mFollowSymlinks( false ), mOutOfScopeLinks( false ) {
	efDEBUG( "Using backend: %s\n", BACKEND_NAME );

	mImpl = new FILEWATCHER_IMPL( this );

	if ( !mImpl->initOK() ) {
		efSAFE_DELETE( mImpl );

		efDEBUG( "Falled back to backend: %s\n", BACKEND_NAME );

		mImpl = new FileWatcherGeneric( this );
	}
}